

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall jsonnet::internal::anon_unknown_0::Parser::parseBind(Parser *this,Binds *binds)

{
  bool bVar1;
  Identifier *__args_1;
  undefined8 uVar2;
  Token *__a;
  AST *__args_5;
  char *in_RDX;
  undefined8 in_RSI;
  Token *in_RDI;
  AST *body;
  Token eq;
  Token paren_l;
  Fodder fodder_r;
  Fodder fodder_l;
  bool trailing_comma;
  ArgParams params;
  bool is_function;
  Bind *bind;
  iterator __end3;
  iterator __begin3;
  Binds *__range3;
  Identifier *id;
  Token var_id;
  Token *delim;
  Token *in_stack_fffffffffffffc08;
  Token *in_stack_fffffffffffffc10;
  Token *pTVar3;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
  *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffc20;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *this_00;
  LocationRange *in_stack_fffffffffffffc28;
  StaticError *in_stack_fffffffffffffc30;
  UString *in_stack_fffffffffffffc40;
  Allocator *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  Token *this_01;
  uint max_precedence;
  Parser *this_02;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
  *in_stack_fffffffffffffc98;
  bool *in_stack_fffffffffffffca0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffca8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffcb0;
  allocator<char> local_2a1;
  Fodder *in_stack_fffffffffffffd60;
  bool *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  Parser *in_stack_fffffffffffffd78;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_1a8 [2];
  undefined1 local_171;
  undefined1 local_170 [72];
  Bind *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_120 [4];
  undefined1 local_e0 [136];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [2];
  Kind k;
  
  this_02 = (Parser *)(local_e0 + 8);
  this_01 = in_RDI;
  uVar2 = in_RSI;
  pTVar3 = in_RDI;
  popExpect((Parser *)in_RDI,(Kind)((ulong)in_RSI >> 0x20),in_RDX);
  Token::data32_abi_cxx11_(in_stack_fffffffffffffc08);
  __args_1 = Allocator::makeIdentifier(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffffc10);
  local_e0._0_8_ = __args_1;
  local_120[0]._0_8_ =
       std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
       ::begin((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                *)in_stack_fffffffffffffc08);
  local_128 = (Bind *)std::
                      vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                      ::end((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                             *)in_stack_fffffffffffffc08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                        *)in_stack_fffffffffffffc10,
                       (__normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                        *)in_stack_fffffffffffffc08);
    max_precedence = (uint)((ulong)in_RSI >> 0x20);
    k = (Kind)((ulong)uVar2 >> 0x20);
    if (!bVar1) {
      local_170[0x1e] = 0;
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
                ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)0x1e9a3a);
      local_171 = 0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x1e9a4f);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x1e9a5c);
      __a = peek((Parser *)0x1e9a66);
      if (__a->kind == PAREN_L) {
        pop((Parser *)in_stack_fffffffffffffc28);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48,
                   (allocator<char> *)__a);
        parseParams(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                    in_stack_fffffffffffffd60);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        operator=((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )in_stack_fffffffffffffc20);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd60);
        std::allocator<char>::~allocator(&local_2a1);
        local_170[0x1e] = 1;
        Token::~Token(in_stack_fffffffffffffc10);
      }
      popExpect((Parser *)pTVar3,k,in_RDX);
      __args_5 = parse(this_02,max_precedence);
      pop((Parser *)in_stack_fffffffffffffc28);
      this_00 = local_1a8;
      pTVar3 = (Token *)local_170;
      std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                ((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                  *)this_01,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_RDI,(Identifier **)__args_1,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffffc50,(AST **)in_stack_fffffffffffffc48,(bool *)__a,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)__args_5,in_stack_fffffffffffffc98,in_stack_fffffffffffffca0,
                 in_stack_fffffffffffffca8,in_stack_fffffffffffffcb0);
      Token::~Token(pTVar3);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)this_00);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)this_00);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector(this_00);
      Token::~Token(pTVar3);
      return this_01;
    }
    local_170._64_8_ =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
         ::operator*((__normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                      *)&local_120[0]._M_allocated_capacity);
    if (((reference)local_170._64_8_)->var == (Identifier *)local_e0._0_8_) break;
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
    ::operator++((__normal_iterator<jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                  *)&local_120[0]._M_allocated_capacity);
  }
  local_170[0x1f] = 1;
  uVar2 = __cxa_allocate_exception(0x60);
  std::operator+((char *)__args_1,local_58);
  StaticError::StaticError
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  local_170[0x1f] = 0;
  __cxa_throw(uVar2,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

Token parseBind(Local::Binds &binds)
    {
        Token var_id = popExpect(Token::IDENTIFIER);
        auto *id = alloc->makeIdentifier(var_id.data32());
        for (const auto &bind : binds) {
            if (bind.var == id)
                throw StaticError(var_id.location, "duplicate local var: " + var_id.data);
        }
        bool is_function = false;
        ArgParams params;
        bool trailing_comma = false;
        Fodder fodder_l, fodder_r;
        if (peek().kind == Token::PAREN_L) {
            Token paren_l = pop();
            fodder_l = paren_l.fodder;
            params = parseParams("function parameter", trailing_comma, fodder_r);
            is_function = true;
        }
        Token eq = popExpect(Token::OPERATOR, "=");
        AST *body = parse(MAX_PRECEDENCE);
        Token delim = pop();
        binds.emplace_back(var_id.fodder,
                           id,
                           eq.fodder,
                           body,
                           is_function,
                           fodder_l,
                           params,
                           trailing_comma,
                           fodder_r,
                           delim.fodder);
        return delim;
    }